

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListBuilder * __thiscall
capnp::_::PointerBuilder::getList
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,ElementSize elementSize,
          word *defaultValue)

{
  WirePointer *pWVar1;
  ushort uVar2;
  unsigned_short uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  CapTableBuilder *capTable;
  word *pwVar7;
  uint64_t uVar8;
  int iVar9;
  WirePointer *pWVar10;
  SegmentBuilder *this_00;
  undefined7 in_register_00000011;
  ulong uVar11;
  WirePointer *pWVar12;
  ElementSize oldSize;
  unsigned_short dataSize;
  undefined2 uStack_92;
  uint local_90;
  unsigned_short pointerCount;
  undefined2 uStack_8a;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  Fault f;
  SegmentBuilder *local_48;
  WirePointer *local_40;
  WirePointer *local_38;
  
  local_90 = (uint)CONCAT71(in_register_00000011,elementSize);
  local_40 = this->pointer;
  local_48 = this->segment;
  capTable = this->capTable;
  if ((local_40->field_1).upper32Bits == 0 && (local_40->offsetAndKind).value == 0)
  goto LAB_0018d148;
  pWVar10 = local_40 + (long)((int)(local_40->offsetAndKind).value >> 2) + 1;
  do {
    pWVar12 = local_40;
    this_00 = local_48;
    local_38 = (WirePointer *)defaultValue;
    if (((local_40->offsetAndKind).value & 3) == 2) {
      this_00 = BuilderArena::getSegment
                          ((BuilderArena *)(local_48->super_SegmentReader).arena,
                           (SegmentId)(local_40->field_1).structRef);
      uVar6 = (pWVar12->offsetAndKind).value;
      pwVar7 = (this_00->super_SegmentReader).ptr.ptr;
      uVar11 = (ulong)(uVar6 & 0xfffffff8);
      pWVar1 = (WirePointer *)((long)&pwVar7->content + uVar11);
      pWVar12 = (WirePointer *)((long)&pwVar7[1].content + uVar11);
      if ((uVar6 & 4) == 0) {
        pWVar10 = pWVar12 + ((int)(pWVar1->offsetAndKind).value >> 2);
        pWVar12 = pWVar1;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)(pWVar1->field_1).structRef);
        pWVar10 = (WirePointer *)
                  ((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                  (ulong)((pWVar1->offsetAndKind).value & 0xfffffff8));
      }
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    _kjCondition.left = (pWVar12->offsetAndKind).value & OTHER;
    _kjCondition.right = LIST;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == LIST;
    if (_kjCondition.left != LIST) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[85]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x509,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Called getWritableListPointer() but existing pointer is not a list.\""
                 ,&_kjCondition,
                 (char (*) [85])
                 "Schema mismatch: Called getWritableListPointer() but existing pointer is not a list."
                );
      kj::_::Debug::Fault::~Fault(&f);
      iVar9 = 4;
      goto LAB_0018d75b;
    }
    oldSize = *(ElementSize *)&pWVar12->field_1 & INLINE_COMPOSITE;
    if (oldSize == INLINE_COMPOSITE) {
      _kjCondition.left = (uint)*(uint64_t *)&(pWVar10->offsetAndKind).value & 3;
      _kjCondition.right = STRUCT;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = _kjCondition.left == 0;
      if (_kjCondition.left != 0) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[62]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x518,FAILED,"tag->kind() == WirePointer::STRUCT",
                   "_kjCondition,\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\"",
                   &_kjCondition,
                   (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.");
        kj::_::Debug::Fault::fatal(&f);
      }
      pWVar12 = pWVar10 + 1;
      uVar2 = *(ushort *)&pWVar10->field_1;
      _dataSize = CONCAT22(uStack_92,uVar2);
      uVar3 = (pWVar10->field_1).structRef.ptrCount.value;
      _pointerCount = CONCAT22(uStack_8a,uVar3);
      switch(local_90 & 0xff) {
      case 1:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[123]>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x526,FAILED,(char *)0x0,
                   "\"Schema mismatch: Found struct list where bit list was expected; upgrading boolean \" \"lists to structs is no longer supported.\""
                   ,(char (*) [123])
                    "Schema mismatch: Found struct list where bit list was expected; upgrading boolean lists to structs is no longer supported."
                  );
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
        iVar9 = 4;
        break;
      case 2:
      case 3:
      case 4:
      case 5:
        _kjCondition._0_8_ = &dataSize;
        _kjCondition.op.content.ptr = (char *)0x1;
        _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_256ef3;
        _kjCondition.result = true;
        _kjCondition._25_7_ = 0;
        if (uVar2 != 0) goto switchD_0018d2f6_default;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short&,unsigned_int>&,char_const(&)[73]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x530,FAILED,"dataSize >= ONE * WORDS",
                   "_kjCondition,\"Schema mismatch: Existing list value is incompatible with expected type.\""
                   ,(DebugComparison<unsigned_short_&,_unsigned_int> *)&_kjCondition,
                   (char (*) [73])
                   "Schema mismatch: Existing list value is incompatible with expected type.");
        kj::_::Debug::Fault::~Fault(&f);
        iVar9 = 4;
        break;
      case 6:
        _kjCondition._0_8_ = &pointerCount;
        _kjCondition.op.content.ptr = (char *)0x1;
        _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_256ef3;
        _kjCondition.result = true;
        _kjCondition._25_7_ = 0;
        if (uVar3 != 0) {
          pWVar12 = pWVar12 + uVar2;
          goto switchD_0018d2f6_default;
        }
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short&,unsigned_int>&,char_const(&)[73]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x537,FAILED,"pointerCount >= ONE * POINTERS",
                   "_kjCondition,\"Schema mismatch: Existing list value is incompatible with expected type.\""
                   ,(DebugComparison<unsigned_short_&,_unsigned_int> *)&_kjCondition,
                   (char (*) [73])
                   "Schema mismatch: Existing list value is incompatible with expected type.");
        kj::_::Debug::Fault::~Fault(&f);
        iVar9 = 4;
        break;
      case 7:
        kj::_::unreachable();
      default:
switchD_0018d2f6_default:
        uVar4 = (pWVar10->field_1).structRef.dataSize.value;
        uVar5 = (pWVar10->field_1).structRef.ptrCount.value;
        uVar8 = *(uint64_t *)&(pWVar10->offsetAndKind).value;
        __return_storage_ptr__->segment = this_00;
        __return_storage_ptr__->capTable = capTable;
        __return_storage_ptr__->ptr = (byte *)pWVar12;
        __return_storage_ptr__->elementCount = (uint)uVar8 >> 2 & 0x1fffffff;
        __return_storage_ptr__->step = ((uint)uVar5 + (uint)uVar4) * 0x40;
        __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
        __return_storage_ptr__->structPointerCount = uVar3;
        __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
LAB_0018d4bd:
        iVar9 = 1;
      }
    }
    else {
      _dataSize = (&BITS_PER_ELEMENT_TABLE)[(ulong)*(ElementSize *)&pWVar12->field_1 & 7];
      _pointerCount = (uint)(oldSize == POINTER);
      _kjCondition._0_8_ = &oldSize;
      if ((byte)local_90 == 1) {
        _kjCondition.op.content.ptr = "ormat: ";
        _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_48f46;
        _kjCondition.result = true;
        _kjCondition._25_7_ = 0;
        if (oldSize == BIT) {
LAB_0018d478:
          _kjCondition.result = true;
          _kjCondition._25_7_ = 0;
          uVar6 = (pWVar12->field_1).upper32Bits;
          __return_storage_ptr__->segment = this_00;
          __return_storage_ptr__->capTable = capTable;
          __return_storage_ptr__->ptr = (byte *)pWVar10;
          __return_storage_ptr__->elementCount = uVar6 >> 3;
          __return_storage_ptr__->step = _pointerCount * 0x40 + _dataSize;
          __return_storage_ptr__->structDataSize = _dataSize;
          __return_storage_ptr__->structPointerCount = (ushort)(oldSize == POINTER);
          __return_storage_ptr__->elementSize = oldSize;
          goto LAB_0018d4bd;
        }
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize&,capnp::ElementSize>&,char_const(&)[65]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x54e,FAILED,"oldSize == ElementSize::BIT",
                   "_kjCondition,\"Schema mismatch: Found non-bit list where bit list was expected.\""
                   ,(DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)&_kjCondition,
                   (char (*) [65])"Schema mismatch: Found non-bit list where bit list was expected."
                  );
        kj::_::Debug::Fault::~Fault(&f);
        iVar9 = 4;
      }
      else {
        _kjCondition.op.content.ptr = "ormat: ";
        _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_17f6f9;
        _kjCondition.result = true;
        _kjCondition._25_7_ = 0;
        if (oldSize == BIT) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize&,capnp::ElementSize>&,char_const(&)[65]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x553,FAILED,"oldSize != ElementSize::BIT",
                     "_kjCondition,\"Schema mismatch: Found bit list where non-bit list was expected.\""
                     ,(DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)&_kjCondition,
                     (char (*) [65])
                     "Schema mismatch: Found bit list where non-bit list was expected.");
          kj::_::Debug::Fault::~Fault(&f);
          iVar9 = 4;
        }
        else {
          _kjCondition._0_8_ = &dataSize;
          _kjCondition.op.content.ptr =
               (char *)(ulong)(uint)(&BITS_PER_ELEMENT_TABLE)[(byte)local_90];
          _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_256ef3;
          _kjCondition.result = true;
          _kjCondition._25_7_ = 0;
          if (_dataSize < (uint)(&BITS_PER_ELEMENT_TABLE)[(byte)local_90]) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[73]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x557,FAILED,"dataSize >= dataBitsPerElement(elementSize) * ELEMENTS",
                       "_kjCondition,\"Schema mismatch: Existing list value is incompatible with expected type.\""
                       ,(DebugComparison<unsigned_int_&,_unsigned_int> *)&_kjCondition,
                       (char (*) [73])
                       "Schema mismatch: Existing list value is incompatible with expected type.");
            kj::_::Debug::Fault::~Fault(&f);
            iVar9 = 4;
          }
          else {
            _kjCondition._0_8_ = &pointerCount;
            _kjCondition.op.content.ptr = (char *)(ulong)(uint)((byte)local_90 == 6);
            _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_256ef3;
            _kjCondition.result = true;
            _kjCondition._25_7_ = 0;
            if (((byte)local_90 == 6) <= _pointerCount) goto LAB_0018d478;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[73]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x55b,FAILED,"pointerCount >= pointersPerElement(elementSize) * ELEMENTS",
                       "_kjCondition,\"Schema mismatch: Existing list value is incompatible with expected type.\""
                       ,(DebugComparison<unsigned_int_&,_unsigned_int> *)&_kjCondition,
                       (char (*) [73])
                       "Schema mismatch: Existing list value is incompatible with expected type.");
            kj::_::Debug::Fault::~Fault(&f);
            iVar9 = 4;
          }
        }
      }
    }
LAB_0018d75b:
    defaultValue = (word *)local_38;
    if (iVar9 != 4) {
      return __return_storage_ptr__;
    }
LAB_0018d148:
    if (((WirePointer *)defaultValue == (WirePointer *)0x0) ||
       ((((WirePointer *)defaultValue)->field_1).upper32Bits == 0 &&
        (((WirePointer *)defaultValue)->offsetAndKind).value == 0)) {
      __return_storage_ptr__->ptr = (byte *)0x0;
      __return_storage_ptr__->elementCount = 0;
      __return_storage_ptr__->step = 0;
      __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
      __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
      __return_storage_ptr__->elementSize = (ElementSize)local_90;
      return __return_storage_ptr__;
    }
    pWVar10 = (WirePointer *)
              WireHelpers::copyMessage(&local_48,capTable,&local_40,(WirePointer *)defaultValue);
    defaultValue = (word *)0x0;
  } while( true );
}

Assistant:

ListBuilder PointerBuilder::getList(ElementSize elementSize, const word* defaultValue) {
  return WireHelpers::getWritableListPointer(pointer, segment, capTable, elementSize, defaultValue);
}